

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O1

_Bool ssh1_handle_direction_specific_packet(ssh1_connection_state *s,PktIn *pktin)

{
  int type;
  Seat *pSVar1;
  Ssh *ssh;
  _Bool _Var2;
  size_t sVar3;
  unsigned_long uVar4;
  void *pvVar5;
  char *event;
  unsigned_long uVar6;
  ssh1_channel *psVar7;
  Channel *pCVar8;
  Socket *s_00;
  char *pcVar9;
  PktOut *pPVar10;
  LogContext *pLVar11;
  PktOutQueue *pqb;
  BinarySource *src;
  ptrlen pVar12;
  ssh_rportfwd pf;
  undefined8 local_68;
  char *local_58;
  
  type = pktin->type;
  _Var2 = false;
  switch(type) {
  case 0xe:
  case 0xf:
    if (s->succfail_head == (outstanding_succfail *)0x0) {
      ssh = (s->ppl).ssh;
      pcVar9 = ssh1_pkt_type(type);
      ssh_remote_error(ssh,"Received %s with no outstanding request",pcVar9);
    }
    else {
      ssh1_connection_process_succfail(s,type == 0xe);
      queue_toplevel_callback(ssh1_connection_process_trivial_succfails,s);
    }
    break;
  default:
    goto switchD_00131a05_caseD_10;
  case 0x11:
  case 0x12:
    pVar12 = BinarySource_get_string(pktin->binarysource_);
    if (pktin->binarysource_[0].err != BSE_NO_ERROR) {
      return true;
    }
    pSVar1 = (s->ppl).seat;
    sVar3 = (*pSVar1->vt->output)(pSVar1,SUB14(pktin->type == 0x12,0),pVar12.ptr,pVar12.len);
    if (s->stdout_throttling != false) {
      return true;
    }
    if ((int)sVar3 < 0x8001) {
      return true;
    }
    s->stdout_throttling = true;
    ssh_throttle_conn((s->ppl).ssh,1);
    return true;
  case 0x14:
    uVar6 = BinarySource_get_uint32(pktin->binarysource_);
    pLVar11 = (s->ppl).logctx;
    pcVar9 = dupprintf("Server sent command exit status %d",uVar6 & 0xffffffff);
    logevent_and_free(pLVar11,pcVar9);
    ssh_got_exitcode((s->ppl).ssh,(int)uVar6);
    s->session_terminated = true;
    break;
  case 0x1b:
    uVar6 = BinarySource_get_uint32(pktin->binarysource_);
    if (s->X11_fwd_enabled == false) {
      pPVar10 = (*((s->ppl).bpp)->vt->new_pktout)(0x16);
      BinarySink_put_uint32(pPVar10->binarysink_,uVar6 & 0xffffffff);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar10->qnode);
      pLVar11 = (s->ppl).logctx;
      pcVar9 = "Rejected X11 connect request";
    }
    else {
      psVar7 = (ssh1_channel *)safemalloc(1,0x38,0);
      psVar7->connlayer = s;
      ssh1_channel_init(psVar7);
      psVar7->remoteid = (uint)uVar6;
      pCVar8 = x11_new_channel(s->x11authtree,&psVar7->sc,(char *)0x0,-1,false);
      psVar7->chan = pCVar8;
      psVar7->remoteid = (uint)uVar6;
      psVar7->halfopen = false;
      pPVar10 = (*((s->ppl).bpp)->vt->new_pktout)(0x15);
      BinarySink_put_uint32(pPVar10->binarysink_,(ulong)psVar7->remoteid);
      BinarySink_put_uint32(pPVar10->binarysink_,(ulong)psVar7->localid);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar10->qnode);
      pLVar11 = (s->ppl).logctx;
      pcVar9 = "Opened X11 forward channel";
    }
    pcVar9 = dupprintf(pcVar9);
    logevent_and_free(pLVar11,pcVar9);
    break;
  case 0x1d:
    src = pktin->binarysource_;
    uVar6 = BinarySource_get_uint32(src);
    pVar12 = BinarySource_get_string(src);
    uVar4 = BinarySource_get_uint32(src);
    local_58 = mkstr(pVar12);
    local_68._4_4_ = (int)uVar4;
    pvVar5 = find234(s->rportfwds,&local_68,(cmpfn234)0x0);
    if (pvVar5 == (void *)0x0) {
      pLVar11 = (s->ppl).logctx;
      pcVar9 = dupprintf("Rejected remote port open request for %s:%d",local_58,uVar4 & 0xffffffff);
      logevent_and_free(pLVar11,pcVar9);
LAB_00131e19:
      pPVar10 = (*((s->ppl).bpp)->vt->new_pktout)(0x16);
      BinarySink_put_uint32(pPVar10->binarysink_,uVar6 & 0xffffffff);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar10->qnode);
    }
    else {
      psVar7 = (ssh1_channel *)safemalloc(1,0x38,0);
      psVar7->connlayer = s;
      pLVar11 = (s->ppl).logctx;
      pcVar9 = dupprintf("Received remote port open request for %s:%d",local_58,uVar4 & 0xffffffff);
      logevent_and_free(pLVar11,pcVar9);
      pcVar9 = portfwdmgr_connect(s->portfwdmgr,&psVar7->chan,local_58,(int)uVar4,&psVar7->sc,
                                  *(int *)((long)pvVar5 + 0x18));
      if (pcVar9 != (char *)0x0) {
        pLVar11 = (s->ppl).logctx;
        event = dupprintf("Port open failed: %s",pcVar9);
        logevent_and_free(pLVar11,event);
        safefree(pcVar9);
        ssh1_channel_free(psVar7);
        goto LAB_00131e19;
      }
      ssh1_channel_init(psVar7);
      psVar7->remoteid = (uint)uVar6;
      psVar7->halfopen = false;
      pPVar10 = (*((s->ppl).bpp)->vt->new_pktout)(0x15);
      BinarySink_put_uint32(pPVar10->binarysink_,(ulong)psVar7->remoteid);
      BinarySink_put_uint32(pPVar10->binarysink_,(ulong)psVar7->localid);
      pq_base_push(&((s->ppl).out_pq)->pqb,&pPVar10->qnode);
      pLVar11 = (s->ppl).logctx;
      pcVar9 = dupprintf("Forwarded port opened successfully");
      logevent_and_free(pLVar11,pcVar9);
    }
    safefree(local_58);
    break;
  case 0x1f:
    uVar6 = BinarySource_get_uint32(pktin->binarysource_);
    _Var2 = (*((s->cl).vt)->agent_forwarding_permitted)(&s->cl);
    if (_Var2) {
      psVar7 = (ssh1_channel *)safemalloc(1,0x38,0);
      psVar7->connlayer = s;
      ssh1_channel_init(psVar7);
      psVar7->remoteid = (uint)uVar6;
      psVar7->halfopen = false;
      pCVar8 = portfwd_raw_new(&s->cl,(Plug **)&local_68,true);
      s_00 = agent_connect((Plug *)CONCAT44(local_68._4_4_,(undefined4)local_68));
      pcVar9 = (*s_00->vt->socket_error)(s_00);
      if (pcVar9 == (char *)0x0) {
        portfwd_raw_setup(pCVar8,s_00,&psVar7->sc);
      }
      else {
        portfwd_raw_free(pCVar8);
        pCVar8 = agentf_new(&psVar7->sc);
      }
      psVar7->chan = pCVar8;
      pPVar10 = (*((s->ppl).bpp)->vt->new_pktout)(0x15);
      BinarySink_put_uint32(pPVar10->binarysink_,(ulong)psVar7->remoteid);
      BinarySink_put_uint32(pPVar10->binarysink_,(ulong)psVar7->localid);
      pqb = (s->ppl).out_pq;
    }
    else {
      pPVar10 = (*((s->ppl).bpp)->vt->new_pktout)(0x16);
      BinarySink_put_uint32(pPVar10->binarysink_,uVar6 & 0xffffffff);
      pqb = (s->ppl).out_pq;
    }
    pq_base_push(&pqb->pqb,&pPVar10->qnode);
  }
  _Var2 = true;
switchD_00131a05_caseD_10:
  return _Var2;
}

Assistant:

bool ssh1_handle_direction_specific_packet(
    struct ssh1_connection_state *s, PktIn *pktin)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */

    PktOut *pktout;
    struct ssh1_channel *c;
    unsigned remid;
    struct ssh_rportfwd pf, *pfp;
    ptrlen host, data;
    int port;

    switch (pktin->type) {
      case SSH1_SMSG_SUCCESS:
      case SSH1_SMSG_FAILURE:
        if (!s->succfail_head) {
            ssh_remote_error(s->ppl.ssh,
                             "Received %s with no outstanding request",
                             ssh1_pkt_type(pktin->type));
            return true;
        }

        ssh1_connection_process_succfail(
            s, pktin->type == SSH1_SMSG_SUCCESS);
        queue_toplevel_callback(
            ssh1_connection_process_trivial_succfails, s);

        return true;

      case SSH1_SMSG_X11_OPEN:
        remid = get_uint32(pktin);

        /* Refuse if X11 forwarding is disabled. */
        if (!s->X11_fwd_enabled) {
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_FAILURE);
            put_uint32(pktout, remid);
            pq_push(s->ppl.out_pq, pktout);
            ppl_logevent("Rejected X11 connect request");
        } else {
            c = snew(struct ssh1_channel);
            c->connlayer = s;
            ssh1_channel_init(c);
            c->remoteid = remid;
            c->chan = x11_new_channel(s->x11authtree, &c->sc,
                                      NULL, -1, false);
            c->remoteid = remid;
            c->halfopen = false;

            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_CONFIRMATION);
            put_uint32(pktout, c->remoteid);
            put_uint32(pktout, c->localid);
            pq_push(s->ppl.out_pq, pktout);
            ppl_logevent("Opened X11 forward channel");
        }

        return true;

      case SSH1_SMSG_AGENT_OPEN:
        remid = get_uint32(pktin);

        /* Refuse if agent forwarding is disabled. */
        if (!ssh_agent_forwarding_permitted(&s->cl)) {
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_FAILURE);
            put_uint32(pktout, remid);
            pq_push(s->ppl.out_pq, pktout);
        } else {
            c = snew(struct ssh1_channel);
            c->connlayer = s;
            ssh1_channel_init(c);
            c->remoteid = remid;
            c->halfopen = false;

            /*
             * If possible, make a stream-oriented connection to the
             * agent and set up an ordinary port-forwarding type
             * channel over it.
             */
            Plug *plug;
            Channel *ch = portfwd_raw_new(&s->cl, &plug, true);
            Socket *skt = agent_connect(plug);
            if (!sk_socket_error(skt)) {
                portfwd_raw_setup(ch, skt, &c->sc);
                c->chan = ch;
            } else {
                portfwd_raw_free(ch);

                /*
                 * Otherwise, fall back to the old-fashioned system of
                 * parsing the forwarded data stream ourselves for
                 * message boundaries, and passing each individual
                 * message to the one-off agent_query().
                 */
                c->chan = agentf_new(&c->sc);
            }

            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_CONFIRMATION);
            put_uint32(pktout, c->remoteid);
            put_uint32(pktout, c->localid);
            pq_push(s->ppl.out_pq, pktout);
        }

        return true;

      case SSH1_MSG_PORT_OPEN:
        remid = get_uint32(pktin);
        host = get_string(pktin);
        port = toint(get_uint32(pktin));

        pf.dhost = mkstr(host);
        pf.dport = port;
        pfp = find234(s->rportfwds, &pf, NULL);

        if (!pfp) {
            ppl_logevent("Rejected remote port open request for %s:%d",
                         pf.dhost, port);
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_FAILURE);
            put_uint32(pktout, remid);
            pq_push(s->ppl.out_pq, pktout);
        } else {
            char *err;

            c = snew(struct ssh1_channel);
            c->connlayer = s;
            ppl_logevent("Received remote port open request for %s:%d",
                         pf.dhost, port);
            err = portfwdmgr_connect(
                s->portfwdmgr, &c->chan, pf.dhost, port,
                &c->sc, pfp->addressfamily);

            if (err) {
                ppl_logevent("Port open failed: %s", err);
                sfree(err);
                ssh1_channel_free(c);
                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_FAILURE);
                put_uint32(pktout, remid);
                pq_push(s->ppl.out_pq, pktout);
            } else {
                ssh1_channel_init(c);
                c->remoteid = remid;
                c->halfopen = false;
                pktout = ssh_bpp_new_pktout(
                    s->ppl.bpp, SSH1_MSG_CHANNEL_OPEN_CONFIRMATION);
                put_uint32(pktout, c->remoteid);
                put_uint32(pktout, c->localid);
                pq_push(s->ppl.out_pq, pktout);
                ppl_logevent("Forwarded port opened successfully");
            }
        }

        sfree(pf.dhost);

        return true;

      case SSH1_SMSG_STDOUT_DATA:
      case SSH1_SMSG_STDERR_DATA:
        data = get_string(pktin);
        if (!get_err(pktin)) {
            int bufsize = seat_output(
                s->ppl.seat, pktin->type == SSH1_SMSG_STDERR_DATA,
                data.ptr, data.len);
            if (!s->stdout_throttling && bufsize > SSH1_BUFFER_LIMIT) {
                s->stdout_throttling = true;
                ssh_throttle_conn(s->ppl.ssh, +1);
            }
        }

        return true;

      case SSH1_SMSG_EXIT_STATUS: {
        int exitcode = get_uint32(pktin);
        ppl_logevent("Server sent command exit status %d", exitcode);
        ssh_got_exitcode(s->ppl.ssh, exitcode);

        s->session_terminated = true;
        return true;
      }

      default:
        return false;
    }
}